

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::LiteralExpressionSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x18d) {
    if (((kind != DefaultPatternKeyExpression) && (kind != IntegerLiteralExpression)) &&
       (kind != NullLiteralExpression)) {
      return false;
    }
  }
  else if ((((0x3a < kind - StringLiteralExpression) ||
            ((0x400000000040001U >> ((ulong)(kind - StringLiteralExpression) & 0x3f) & 1) == 0)) &&
           (kind != RealLiteralExpression)) && (kind != WildcardLiteralExpression)) {
    return false;
  }
  return true;
}

Assistant:

bool LiteralExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultPatternKeyExpression:
        case SyntaxKind::IntegerLiteralExpression:
        case SyntaxKind::NullLiteralExpression:
        case SyntaxKind::RealLiteralExpression:
        case SyntaxKind::StringLiteralExpression:
        case SyntaxKind::TimeLiteralExpression:
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
        case SyntaxKind::WildcardLiteralExpression:
            return true;
        default:
            return false;
    }
}